

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.h
# Opt level: O3

int icu_63::double_conversion::Bignum::Compare(Bignum *a,Bignum *b)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint *puVar10;
  long lVar11;
  
  iVar2 = a->exponent_;
  lVar1 = (long)iVar2 + (long)a->used_digits_;
  iVar3 = b->exponent_;
  lVar9 = (long)iVar3;
  lVar8 = b->used_digits_ + lVar9;
  iVar4 = -1;
  iVar7 = (int)lVar8;
  if (iVar7 <= (int)lVar1) {
    if ((int)lVar1 <= iVar7) {
      if (iVar2 < iVar3) {
        iVar3 = iVar2;
      }
      puVar10 = (a->bigits_).start_ + a->used_digits_;
      lVar11 = lVar1;
      while( true ) {
        puVar10 = puVar10 + -1;
        if (lVar11 <= iVar3) {
          return 0;
        }
        uVar5 = 0;
        uVar6 = 0;
        if (iVar2 < lVar11 && lVar11 <= lVar1) {
          uVar6 = *puVar10;
        }
        if (lVar9 < lVar11 && lVar11 <= lVar8) {
          uVar5 = (b->bigits_).start_[(lVar11 + -1) - lVar9];
        }
        if (uVar6 < uVar5) break;
        lVar11 = lVar11 + -1;
        if (uVar5 < uVar6) {
          return 1;
        }
      }
      return -1;
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int BigitLength() const { return used_digits_ + exponent_; }